

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL> __thiscall
slang::ast::CheckerInstanceSymbol::getPortConnections(CheckerInstanceSymbol *this)

{
  tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *this_00;
  pointer pCVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  size_t sVar4;
  AssertionInstanceDetails *pAVar5;
  Symbol *pSVar6;
  value_type_pointer ppVar7;
  PropertyExprSyntax *initialExpr;
  uint uVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  ExpressionSyntax *syntax;
  Type *argType;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  Connection *conn;
  pointer this_01;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  undefined1 auVar20 [16];
  span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL> sVar21;
  ActualArg actualArgValue;
  Expression *local_70;
  _Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
  local_68;
  ulong uStack_60;
  ulong local_58;
  Symbol *pSStack_50;
  TempVarSymbol *local_48;
  RandomizeDetails *pRStack_40;
  AssertionInstanceDetails *local_38;
  
  if (this->connectionsResolved != true) {
    this->connectionsResolved = true;
    sVar4 = (this->connections)._M_extent._M_extent_value;
    if (sVar4 != 0) {
      this_01 = (this->connections)._M_ptr;
      pCVar1 = this_01 + sVar4;
LAB_001f64c6:
      Connection::getOutputInitialExpr(this_01);
      pAVar5 = this->body->assertionDetails;
      pSVar6 = this_01->formal;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = pSVar6;
      uVar12 = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar13 = uVar12 >> ((byte)(pAVar5->argumentMap).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                                .arrays.groups_size_index & 0x3f);
      uVar3 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar12 & 0xff];
      lVar11 = 0;
      do {
        pgVar2 = (pAVar5->argumentMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                 .arrays.groups_ + uVar13;
        uVar16 = (uchar)uVar3;
        auVar20[0] = -(pgVar2->m[0].n == uVar16);
        uVar17 = (uchar)((uint)uVar3 >> 8);
        auVar20[1] = -(pgVar2->m[1].n == uVar17);
        uVar18 = (uchar)((uint)uVar3 >> 0x10);
        auVar20[2] = -(pgVar2->m[2].n == uVar18);
        uVar19 = (uchar)((uint)uVar3 >> 0x18);
        auVar20[3] = -(pgVar2->m[3].n == uVar19);
        auVar20[4] = -(pgVar2->m[4].n == uVar16);
        auVar20[5] = -(pgVar2->m[5].n == uVar17);
        auVar20[6] = -(pgVar2->m[6].n == uVar18);
        auVar20[7] = -(pgVar2->m[7].n == uVar19);
        auVar20[8] = -(pgVar2->m[8].n == uVar16);
        auVar20[9] = -(pgVar2->m[9].n == uVar17);
        auVar20[10] = -(pgVar2->m[10].n == uVar18);
        auVar20[0xb] = -(pgVar2->m[0xb].n == uVar19);
        auVar20[0xc] = -(pgVar2->m[0xc].n == uVar16);
        auVar20[0xd] = -(pgVar2->m[0xd].n == uVar17);
        auVar20[0xe] = -(pgVar2->m[0xe].n == uVar18);
        auVar20[0xf] = -(pgVar2->m[0xf].n == uVar19);
        uVar15 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
        if (uVar15 != 0) {
          ppVar7 = (pAVar5->argumentMap).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   .arrays.elements_;
          do {
            uVar8 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            uVar12 = (ulong)uVar8;
            if (pSVar6 == ppVar7[uVar13 * 0xf + uVar12].first) {
              initialExpr = ppVar7[uVar13 * 0xf + uVar12].second.
                            super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                            .super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>
                            ._M_head_impl;
              if (initialExpr != (PropertyExprSyntax *)0x0) {
                this_00 = &ppVar7[uVar13 * 0xf + uVar12].second;
                if (pSVar6->kind == AssertionPort) {
                  local_68 = (_Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                              )0x0;
                  uStack_60 = uStack_60 & 0xffffffffffffff00;
                  bVar10 = AssertionInstanceExpression::checkAssertionArg
                                     (initialExpr,(AssertionPortSymbol *)this_01->formal,
                                      (ASTContext *)this_00,(ActualArg *)&local_68._M_first,false);
                  if (bVar10) {
                    *(__index_type *)
                     ((long)&(this_01->actual).
                             super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             .
                             super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             .
                             super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             .
                             super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             .
                             super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             .
                             super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                     + 8) = (__index_type)uStack_60;
                    (this_01->actual).
                    super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                    .
                    super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                    .
                    super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                    .
                    super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                    .
                    super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                    .
                    super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                    ._M_u = local_68;
                  }
                }
                else {
                  syntax = ASTContext::requireSimpleExpr((ASTContext *)this_00,initialExpr);
                  if (syntax != (ExpressionSyntax *)0x0) {
                    local_38 = ppVar7[uVar13 * 0xf + uVar12].second.
                               super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                               .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                               super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                               assertionInstance;
                    local_68._M_first._M_storage =
                         (_Uninitialized<const_slang::ast::Expression_*,_true>)
                         (this_00->
                         super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                         ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                         super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr
                    ;
                    uStack_60 = *(ulong *)&ppVar7[uVar13 * 0xf + uVar12].second.
                                           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                                           .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                                           super__Head_base<1UL,_slang::ast::ASTContext,_false>.
                                           _M_head_impl.lookupIndex;
                    local_58 = ppVar7[uVar13 * 0xf + uVar12].second.
                               super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                               .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                               super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                               flags.m_bits;
                    pSStack_50 = ppVar7[uVar13 * 0xf + uVar12].second.
                                 super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                                 .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                                 instanceOrProc;
                    local_48 = ppVar7[uVar13 * 0xf + uVar12].second.
                               super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                               .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                               super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                               firstTempVar;
                    pRStack_40 = ppVar7[uVar13 * 0xf + uVar12].second.
                                 super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                                 .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                                 randomizeDetails;
                    if (this->body->isProcedural == false) {
                      local_58 = local_58 | 0x20;
                    }
                    if (((this->body->flags).m_bits & 2) != 0) {
                      local_58 = local_58 | 0x100000000000;
                    }
                    pSVar6 = this_01->formal;
                    argType = DeclaredType::getType((DeclaredType *)(pSVar6 + 1));
                    local_70 = Expression::bindArgument
                                         (argType,*(ArgumentDirection *)&pSVar6[5].location,
                                          (bitmask<slang::ast::VariableFlags>)0x0,syntax,
                                          (ASTContext *)&local_68._M_first);
                    std::
                    variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                    ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                                 *)&this_01->actual,&local_70);
                  }
                }
              }
              this_01 = this_01 + 1;
              if (this_01 == pCVar1) goto LAB_001f668c;
              goto LAB_001f64c6;
            }
            uVar15 = uVar15 - 1 & uVar15;
          } while (uVar15 != 0);
        }
        lVar14 = uVar13 + lVar11;
        lVar11 = lVar11 + 1;
        uVar13 = lVar14 + 1U &
                 (pAVar5->argumentMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                 .arrays.groups_size_mask;
      } while( true );
    }
  }
LAB_001f668c:
  sVar21._M_ptr = (this->connections)._M_ptr;
  sVar21._M_extent._M_extent_value = (this->connections)._M_extent._M_extent_value;
  return sVar21;
}

Assistant:

std::span<const CheckerInstanceSymbol::Connection> CheckerInstanceSymbol::getPortConnections()
    const {
    if (connectionsResolved)
        return connections;

    connectionsResolved = true;

    // We prepopulated some of the connection members but still need
    // to resolve the actual argument value and save it.
    for (auto& conn : connections) {
        conn.getOutputInitialExpr();

        auto argIt = body.assertionDetails.argumentMap.find(&conn.formal);
        SLANG_ASSERT(argIt != body.assertionDetails.argumentMap.end());

        auto& [expr, argCtx] = argIt->second;
        if (!expr)
            continue;

        if (conn.formal.kind == SymbolKind::AssertionPort) {
            AssertionInstanceExpression::ActualArg actualArgValue;
            if (AssertionInstanceExpression::checkAssertionArg(
                    *expr, conn.formal.as<AssertionPortSymbol>(), argCtx, actualArgValue,
                    /* isRecursiveProp */ false)) {
                conn.actual = actualArgValue;
            }
        }
        else if (auto exprSyntax = argCtx.requireSimpleExpr(*expr)) {
            ASTContext context = argCtx;
            if (!body.isProcedural)
                context.flags |= ASTFlags::NonProcedural;

            if (body.flags.has(InstanceFlags::FromBind))
                context.flags |= ASTFlags::BindInstantiation;

            auto& formal = conn.formal.as<FormalArgumentSymbol>();
            conn.actual = &Expression::bindArgument(formal.getType(), formal.direction, {},
                                                    *exprSyntax, context);
        }
    }

    return connections;
}